

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_edge
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *s)

{
  bool bVar1;
  _Self *__x;
  reference pVVar2;
  Edge_handle local_58;
  boost_vertex_handle local_40;
  Vertex_handle local_3c;
  _Self local_38;
  _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_30;
  const_iterator j;
  _Self local_20;
  const_iterator i;
  Simplex *s_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  i._M_node = (_Base_ptr)s;
  local_20._M_node =
       (_Base_ptr)
       Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
       ::begin(s);
  while( true ) {
    j = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
        ::end(i._M_node);
    bVar1 = std::operator!=(&local_20,&j);
    if (!bVar1) break;
    local_30._M_node = local_20._M_node;
    while( true ) {
      __x = std::
            _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ::operator++(&local_30);
      local_38._M_node =
           (_Base_ptr)
           Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           ::end(i._M_node);
      bVar1 = std::operator!=(__x,&local_38);
      if (!bVar1) break;
      pVVar2 = std::
               _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               ::operator*(&local_20);
      local_3c.vertex = pVVar2->vertex;
      pVVar2 = std::
               _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               ::operator*(&local_30);
      local_40 = pVVar2->vertex;
      add_edge(&local_58,this,local_3c,(Vertex_handle)local_40);
    }
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void add_edge(const Simplex& s) {
    for (auto i = s.begin(); i != s.end(); ++i)
      for (auto j = i; ++j != s.end(); /**/)
        add_edge(*i, *j);
  }